

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMSlicer.h
# Opt level: O2

bool __thiscall dg::llvmdg::LLVMSlicer::removeBlock(LLVMSlicer *this,LLVMBBlock *block)

{
  BasicBlock *blk;
  _Base_ptr p_Var1;
  BasicBlock *__range2;
  BasicBlock *pBVar2;
  Value *pVVar3;
  BasicBlock *pBVar4;
  
  blk = (BasicBlock *)block->key;
  if (blk != (BasicBlock *)0x0) {
    for (p_Var1 = (block->nextBBs).container._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        pBVar4 = blk,
        (_Rb_tree_header *)p_Var1 != &(block->nextBBs).container._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
      if (((*(char *)&p_Var1[1]._M_parent != -1) && (*(LLVMBBlock **)(p_Var1 + 1) != block)) &&
         (pBVar4 = (BasicBlock *)(*(LLVMBBlock **)(p_Var1 + 1))->key, pBVar4 != (BasicBlock *)0x0))
      {
        adjustPhiNodes(pBVar4,blk);
      }
    }
    while (pBVar4 = *(BasicBlock **)(pBVar4 + 8), pBVar4 != (BasicBlock *)0x0) {
      llvm::User::replaceUsesOfWith(*(Value **)(pBVar4 + 0x18),(Value *)blk);
    }
    for (pBVar4 = blk + 0x30; pBVar4 = *(BasicBlock **)pBVar4, pBVar4 != blk + 0x28;
        pBVar4 = pBVar4 + 8) {
      pBVar2 = pBVar4 + -0x18;
      pVVar3 = (Value *)pBVar2;
      if (pBVar4 == (BasicBlock *)0x0) {
        pBVar2 = (BasicBlock *)0x0;
        pVVar3 = (Value *)pBVar2;
      }
      while (pBVar2 = *(BasicBlock **)(pBVar2 + 8), pBVar2 != (BasicBlock *)0x0) {
        llvm::User::replaceUsesOfWith(*(Value **)(pBVar2 + 0x18),pVVar3);
      }
    }
    llvm::BasicBlock::eraseFromParent();
  }
  return true;
}

Assistant:

bool removeBlock(LLVMBBlock *block) override {
        assert(block);

        llvm::Value *val = block->getKey();
        if (val == nullptr)
            return true;

        llvm::BasicBlock *blk = llvm::cast<llvm::BasicBlock>(val);
        for (const auto &succ : block->successors()) {
            if (succ.label == LLVMBBlock::ARTIFICIAL_BBLOCK_LABEL)
                continue;

            // don't adjust phi nodes in this block if this is a self-loop,
            // we're gonna remove the block anyway
            if (succ.target == block)
                continue;

            if (llvm::Value *sval = succ.target->getKey())
                adjustPhiNodes(llvm::cast<llvm::BasicBlock>(sval), blk);
        }

        // We need to drop the reference to this block in all
        // braching instructions that jump to this block.
        // See #99
        dropAllUses(blk);

        // we also must drop refrences to instructions that are in
        // this block (or we would need to delete the blocks in
        // post-dominator order), see #101
        for (llvm::Instruction &Inst : *blk)
            dropAllUses(&Inst);

        // finally, erase the block per se
        blk->eraseFromParent();
        return true;
    }